

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O0

HeapType __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::pickSubArray
          (HeapTypeGeneratorImpl *this,Shareability share)

{
  bool bVar1;
  uint32_t uVar2;
  BasicHeapType BVar3;
  HeapType *pHVar4;
  optional<wasm::HeapType> oVar5;
  HeapType local_38;
  HeapType ht;
  optional<wasm::HeapType> type;
  uint32_t choice;
  Shareability share_local;
  HeapTypeGeneratorImpl *this_local;
  
  uVar2 = Random::upTo(this->rand,8);
  if (uVar2 == 0) {
    BVar3 = HeapType::getBasic((HeapType *)&HeapTypes::array,share);
    HeapType::HeapType((HeapType *)&this_local,BVar3);
  }
  else if (uVar2 == 1) {
    BVar3 = HeapType::getBasic((HeapType *)&HeapTypes::none,share);
    HeapType::HeapType((HeapType *)&this_local,BVar3);
  }
  else {
    oVar5 = pickKind<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>(this,share);
    ht.id = oVar5.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_payload;
    bVar1 = std::optional::operator_cast_to_bool((optional *)&ht);
    if (bVar1) {
      pHVar4 = std::optional<wasm::HeapType>::operator*((optional<wasm::HeapType> *)&ht);
      this_local = (HeapTypeGeneratorImpl *)pHVar4->id;
    }
    else {
      BVar3 = none;
      if ((uVar2 & 1) != 0) {
        BVar3 = array;
      }
      HeapType::HeapType(&local_38,BVar3);
      BVar3 = HeapType::getBasic(&local_38,share);
      HeapType::HeapType((HeapType *)&this_local,BVar3);
    }
  }
  return (HeapType)(uintptr_t)this_local;
}

Assistant:

HeapType pickSubArray(Shareability share) {
    auto choice = rand.upTo(8);
    switch (choice) {
      case 0:
        return HeapTypes::array.getBasic(share);
      case 1:
        return HeapTypes::none.getBasic(share);
      default: {
        if (auto type = pickKind<ArrayKind>(share)) {
          return *type;
        }
        HeapType ht = (choice % 2) ? HeapType::array : HeapType::none;
        return ht.getBasic(share);
      }
    }
  }